

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::currency
          (AffixTokenMatcherWarehouse *this,UErrorCode *status)

{
  CombinedCurrencyMatcher *pCVar1;
  CombinedCurrencyMatcher local_2f0;
  UErrorCode *local_18;
  UErrorCode *status_local;
  AffixTokenMatcherWarehouse *this_local;
  
  local_18 = status;
  status_local = (UErrorCode *)this;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            (&local_2f0,this->fSetupData->currencySymbols,this->fSetupData->dfs,
             this->fSetupData->parseFlags,status);
  pCVar1 = CombinedCurrencyMatcher::operator=(&this->fCurrency,&local_2f0);
  CombinedCurrencyMatcher::~CombinedCurrencyMatcher(&local_2f0);
  return &pCVar1->super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::currency(UErrorCode& status) {
    return fCurrency = {fSetupData->currencySymbols, fSetupData->dfs, fSetupData->parseFlags, status};
}